

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_4280d61::DumpVisitor::onValue(DumpVisitor *this,uint64_t U,bool LEB)

{
  raw_ostream *this_00;
  char *__n;
  bool bVar1;
  uint uVar2;
  size_t in_RCX;
  undefined7 in_register_00000011;
  char *__buf;
  char *extraout_RDX;
  ulong local_20;
  
  __buf = (char *)CONCAT71(in_register_00000011,LEB);
  this_00 = this->OS;
  if ((int)__buf == 0) {
    local_20 = U >> 0x38 | (U & 0xff000000000000) >> 0x28 | (U & 0xff0000000000) >> 0x18 |
               (U & 0xff00000000) >> 8 | (U & 0xff000000) << 8 | (U & 0xff0000) << 0x18 |
               (U & 0xff00) << 0x28 | U << 0x38;
    if (((this->super_ConstVisitor).super_VisitorImpl<const_llvm::DWARFYAML::Data>.DebugInfo)->
        IsLittleEndian != false) {
      local_20 = U;
    }
    llvm::raw_ostream::write(this_00,(int)&local_20,&DAT_00000008,in_RCX);
  }
  else {
    do {
      uVar2 = (uint)(byte)((byte)U | 0x80);
      if (U < 0x80) {
        uVar2 = (uint)U;
      }
      __n = this_00->OutBufCur;
      if (__n < this_00->OutBufEnd) {
        __buf = __n + 1;
        this_00->OutBufCur = __buf;
        *__n = (char)uVar2;
      }
      else {
        llvm::raw_ostream::write(this_00,uVar2 & 0xff,__buf,(size_t)__n);
        __buf = extraout_RDX;
      }
      bVar1 = 0x7f < U;
      U = U >> 7;
    } while (bVar1);
  }
  return;
}

Assistant:

void onValue(const uint64_t U, const bool LEB = false) override {
    if (LEB)
      encodeULEB128(U, OS);
    else
      writeInteger(U, OS, DebugInfo.IsLittleEndian);
  }